

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::PlayerInfo::start_resolve_rdns(PlayerInfo *this)

{
  thread local_28;
  undefined1 local_20 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rdns_string;
  PlayerInfo *this_local;
  
  this->rdns_pending = true;
  rdns_string.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::make_shared<std::__cxx11::string>();
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&this->m_rdns_ptr,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_20);
  std::thread::
  thread<void(&)(std::__cxx11::string,std::shared_ptr<std::__cxx11::string>),std::__cxx11::string&,std::shared_ptr<std::__cxx11::string>,void>
            (&local_28,resolve_rdns,&this->ip,
             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_20);
  std::thread::detach();
  std::thread::~thread(&local_28);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_20);
  return;
}

Assistant:

void RenX::PlayerInfo::start_resolve_rdns() {
	rdns_pending = true;

	auto rdns_string = std::make_shared<std::string>();
	m_rdns_ptr = rdns_string;
	std::thread(resolve_rdns, ip, std::move(rdns_string)).detach();
}